

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrPlaneDetectorBeginInfoEXT *value)

{
  bool bVar1;
  NextChainResult NVar2;
  ValidateXrHandleResult VVar3;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *p_Var4;
  XrResult XVar5;
  ulong uVar6;
  undefined4 in_stack_fffffffffffffce8;
  uint32_t in_stack_fffffffffffffcec;
  allocator local_309;
  GenValidUsageXrInstanceInfo *local_308;
  string local_300;
  string *local_2e0;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *local_2d8;
  allocator local_2c9;
  string local_2c8;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_270;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_258;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_240;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_228;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_210;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1e0;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  string error_message;
  
  XVar5 = XR_SUCCESS;
  local_308 = instance_info;
  local_2e0 = command_name;
  local_2d8 = objects_info;
  if (value->type != XR_TYPE_PLANE_DETECTOR_BEGIN_INFO_EXT) {
    XVar5 = XR_ERROR_VALIDATION_FAILURE;
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrPlaneDetectorBeginInfoEXT",value->type,
               "VUID-XrPlaneDetectorBeginInfoEXT-type-type",XR_TYPE_PLANE_DETECTOR_BEGIN_INFO_EXT,
               "XR_TYPE_PLANE_DETECTOR_BEGIN_INFO_EXT");
  }
  if (check_pnext) {
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    NVar2 = ValidateNextChain(local_308,local_2e0,local_2d8,value->next,&valid_ext_structs,
                              &encountered_structs,&duplicate_ext_structs);
    if (NVar2 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
      std::__cxx11::string::string
                ((string *)&error_message,
                 "Multiple structures of the same type(s) in \"next\" chain for ",
                 (allocator *)&local_300);
      std::__cxx11::string::append((char *)&error_message);
      StructTypesToString_abi_cxx11_(&local_300,local_308,&duplicate_ext_structs);
      std::__cxx11::string::append((string *)&error_message);
      std::__cxx11::string::~string((string *)&local_300);
      std::__cxx11::string::string
                ((string *)&local_300,"VUID-XrPlaneDetectorBeginInfoEXT-next-unique",&local_309);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1f8,local_2d8);
      std::__cxx11::string::string
                ((string *)&local_2c8,
                 "Multiple structures of the same type(s) in \"next\" chain for XrPlaneDetectorBeginInfoEXT struct"
                 ,&local_2c9);
      CoreValidLogMessage(local_308,&local_300,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2e0,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1f8,&local_2c8);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_1f8);
      std::__cxx11::string::~string((string *)&local_300);
LAB_001b1383:
      std::__cxx11::string::~string((string *)&error_message);
      XVar5 = XR_ERROR_VALIDATION_FAILURE;
    }
    else if (NVar2 == NEXT_CHAIN_RESULT_ERROR) {
      std::__cxx11::string::string
                ((string *)&error_message,"VUID-XrPlaneDetectorBeginInfoEXT-next-next",
                 (allocator *)&local_2c8);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1e0,local_2d8);
      std::__cxx11::string::string
                ((string *)&local_300,
                 "Invalid structure(s) in \"next\" chain for XrPlaneDetectorBeginInfoEXT struct \"next\""
                 ,&local_309);
      CoreValidLogMessage(local_308,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2e0,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1e0,&local_300);
      std::__cxx11::string::~string((string *)&local_300);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_1e0);
      goto LAB_001b1383;
    }
    std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
              (&encountered_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
    std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
              (&duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
    std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
              (&valid_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  }
  if (!check_members || XVar5 != XR_SUCCESS) {
    return XVar5;
  }
  VVar3 = VerifyXrSpaceHandle(&value->baseSpace);
  if (VVar3 != VALIDATE_XR_HANDLE_SUCCESS) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    std::operator<<((ostream *)&error_message,"Invalid XrSpace handle \"baseSpace\" ");
    HandleToHexString<XrSpace_T*>
              ((XrSpace_T *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    std::operator<<((ostream *)&error_message,(string *)&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::string
              ((string *)&local_300,"VUID-XrPlaneDetectorBeginInfoEXT-baseSpace-parameter",
               (allocator *)&valid_ext_structs);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_210,local_2d8);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage(local_308,&local_300,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2e0,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_210,&local_2c8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_210);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
    return XR_ERROR_HANDLE_INVALID;
  }
  if (value->orientationCount == 0) {
    if (value->orientations == (XrPlaneDetectorOrientationEXT *)0x0) {
LAB_001b16a7:
      if (value->semanticTypeCount == 0) {
        if (value->semanticTypes == (XrPlaneDetectorSemanticTypeEXT *)0x0) {
          return XR_SUCCESS;
        }
      }
      else if (value->semanticTypes == (XrPlaneDetectorSemanticTypeEXT *)0x0) {
        std::__cxx11::string::string
                  ((string *)&error_message,
                   "VUID-XrPlaneDetectorBeginInfoEXT-semanticTypes-parameter",
                   (allocator *)&local_2c8);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_258,local_2d8);
        std::__cxx11::string::string
                  ((string *)&local_300,
                   "Structure XrPlaneDetectorBeginInfoEXT member semanticTypeCount is NULL, but value->semanticTypeCount is greater than 0"
                   ,(allocator *)&valid_ext_structs);
        CoreValidLogMessage(local_308,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2e0,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_258,&local_300);
        std::__cxx11::string::~string((string *)&local_300);
        p_Var4 = &local_258;
        goto LAB_001b173b;
      }
      uVar6 = 0;
      do {
        if (value->semanticTypeCount <= uVar6) {
          return XR_SUCCESS;
        }
        std::__cxx11::string::string
                  ((string *)&error_message,"XrPlaneDetectorBeginInfoEXT",(allocator *)&local_2c8);
        std::__cxx11::string::string
                  ((string *)&local_300,"semanticTypes",(allocator *)&valid_ext_structs);
        bVar1 = ValidateXrEnum(local_308,local_2e0,&error_message,&local_300,local_2d8,
                               value->semanticTypes[uVar6]);
        std::__cxx11::string::~string((string *)&local_300);
        std::__cxx11::string::~string((string *)&error_message);
        uVar6 = uVar6 + 1;
      } while (bVar1);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
      std::operator<<((ostream *)&error_message,
                      "XrPlaneDetectorBeginInfoEXT contains invalid XrPlaneDetectorSemanticTypeEXT \"semanticTypes\" enum value "
                     );
      Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffcec);
      std::operator<<((ostream *)&error_message,(string *)&local_300);
      std::__cxx11::string::~string((string *)&local_300);
      std::__cxx11::string::string
                ((string *)&local_300,"VUID-XrPlaneDetectorBeginInfoEXT-semanticTypes-parameter",
                 (allocator *)&valid_ext_structs);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_270,local_2d8);
      std::__cxx11::stringbuf::str();
      CoreValidLogMessage(local_308,&local_300,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2e0,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_270,&local_2c8);
      std::__cxx11::string::~string((string *)&local_2c8);
      p_Var4 = &local_270;
      goto LAB_001b18a1;
    }
  }
  else if (value->orientations == (XrPlaneDetectorOrientationEXT *)0x0) {
    std::__cxx11::string::string
              ((string *)&error_message,"VUID-XrPlaneDetectorBeginInfoEXT-orientations-parameter",
               (allocator *)&local_2c8);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_228,local_2d8);
    std::__cxx11::string::string
              ((string *)&local_300,
               "Structure XrPlaneDetectorBeginInfoEXT member orientationCount is NULL, but value->orientationCount is greater than 0"
               ,(allocator *)&valid_ext_structs);
    CoreValidLogMessage(local_308,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2e0,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_228,&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    p_Var4 = &local_228;
LAB_001b173b:
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(p_Var4);
    std::__cxx11::string::~string((string *)&error_message);
    return XR_ERROR_VALIDATION_FAILURE;
  }
  uVar6 = 0;
  do {
    if (value->orientationCount <= uVar6) goto LAB_001b16a7;
    std::__cxx11::string::string
              ((string *)&error_message,"XrPlaneDetectorBeginInfoEXT",(allocator *)&local_2c8);
    std::__cxx11::string::string
              ((string *)&local_300,"orientations",(allocator *)&valid_ext_structs);
    bVar1 = ValidateXrEnum(local_308,local_2e0,&error_message,&local_300,local_2d8,
                           value->orientations[uVar6]);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&error_message);
    uVar6 = uVar6 + 1;
  } while (bVar1);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
  std::operator<<((ostream *)&error_message,
                  "XrPlaneDetectorBeginInfoEXT contains invalid XrPlaneDetectorOrientationEXT \"orientations\" enum value "
                 );
  Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffcec);
  std::operator<<((ostream *)&error_message,(string *)&local_300);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::string
            ((string *)&local_300,"VUID-XrPlaneDetectorBeginInfoEXT-orientations-parameter",
             (allocator *)&valid_ext_structs);
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             &local_240,local_2d8);
  std::__cxx11::stringbuf::str();
  CoreValidLogMessage(local_308,&local_300,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2e0,
                      (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                       *)&local_240,&local_2c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  p_Var4 = &local_240;
LAB_001b18a1:
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(p_Var4);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
  return XR_ERROR_VALIDATION_FAILURE;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrPlaneDetectorBeginInfoEXT* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_PLANE_DETECTOR_BEGIN_INFO_EXT) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrPlaneDetectorBeginInfoEXT",
                             value->type, "VUID-XrPlaneDetectorBeginInfoEXT-type-type", XR_TYPE_PLANE_DETECTOR_BEGIN_INFO_EXT, "XR_TYPE_PLANE_DETECTOR_BEGIN_INFO_EXT");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrPlaneDetectorBeginInfoEXT-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrPlaneDetectorBeginInfoEXT struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrPlaneDetectorBeginInfoEXT : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrPlaneDetectorBeginInfoEXT-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrPlaneDetectorBeginInfoEXT struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    {
        // writeValidateInlineHandleValidation
        ValidateXrHandleResult handle_result = VerifyXrSpaceHandle(&value->baseSpace);
        if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
            // Not a valid handle or NULL (which is not valid in this case)
            std::ostringstream oss;
            oss << "Invalid XrSpace handle \"baseSpace\" ";
            oss << HandleToHexString(value->baseSpace);
            CoreValidLogMessage(instance_info, "VUID-XrPlaneDetectorBeginInfoEXT-baseSpace-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, oss.str());
            return XR_ERROR_HANDLE_INVALID;
        }
    }
    // Optional array must be non-NULL when value->orientationCount is non-zero
    if (0 != value->orientationCount && nullptr == value->orientations) {
        CoreValidLogMessage(instance_info, "VUID-XrPlaneDetectorBeginInfoEXT-orientations-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrPlaneDetectorBeginInfoEXT member orientationCount is NULL, but value->orientationCount is greater than 0");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->orientations) {
        for (uint32_t value_orientations_inc = 0; value_orientations_inc < value->orientationCount; ++value_orientations_inc) {
            // Make sure the enum type XrPlaneDetectorOrientationEXT value is valid
            if (!ValidateXrEnum(instance_info, command_name, "XrPlaneDetectorBeginInfoEXT", "orientations", objects_info, value->orientations[value_orientations_inc])) {
                std::ostringstream oss_enum;
                oss_enum << "XrPlaneDetectorBeginInfoEXT contains invalid XrPlaneDetectorOrientationEXT \"orientations\" enum value ";
                oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->orientations[value_orientations_inc]));
                CoreValidLogMessage(instance_info, "VUID-XrPlaneDetectorBeginInfoEXT-orientations-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info, oss_enum.str());
                return XR_ERROR_VALIDATION_FAILURE;
            }
        }
    }
    // Optional array must be non-NULL when value->semanticTypeCount is non-zero
    if (0 != value->semanticTypeCount && nullptr == value->semanticTypes) {
        CoreValidLogMessage(instance_info, "VUID-XrPlaneDetectorBeginInfoEXT-semanticTypes-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrPlaneDetectorBeginInfoEXT member semanticTypeCount is NULL, but value->semanticTypeCount is greater than 0");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->semanticTypes) {
        for (uint32_t value_semantictypes_inc = 0; value_semantictypes_inc < value->semanticTypeCount; ++value_semantictypes_inc) {
            // Make sure the enum type XrPlaneDetectorSemanticTypeEXT value is valid
            if (!ValidateXrEnum(instance_info, command_name, "XrPlaneDetectorBeginInfoEXT", "semanticTypes", objects_info, value->semanticTypes[value_semantictypes_inc])) {
                std::ostringstream oss_enum;
                oss_enum << "XrPlaneDetectorBeginInfoEXT contains invalid XrPlaneDetectorSemanticTypeEXT \"semanticTypes\" enum value ";
                oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->semanticTypes[value_semantictypes_inc]));
                CoreValidLogMessage(instance_info, "VUID-XrPlaneDetectorBeginInfoEXT-semanticTypes-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info, oss_enum.str());
                return XR_ERROR_VALIDATION_FAILURE;
            }
        }
    }
    // Everything checked out properly
    return xr_result;
}